

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

bool __thiscall BanMan::Unban(BanMan *this,CNetAddr *net_addr)

{
  long lVar1;
  bool bVar2;
  CNetAddr *in_RSI;
  CSubNet *in_RDI;
  long in_FS_OFFSET;
  CSubNet sub_net;
  CSubNet *in_stack_ffffffffffffff88;
  BanMan *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(in_RDI,in_RSI);
  bVar2 = Unban(in_stack_ffffffffffffffc0,in_RDI);
  CSubNet::~CSubNet(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::Unban(const CNetAddr& net_addr)
{
    CSubNet sub_net(net_addr);
    return Unban(sub_net);
}